

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

void boost::filesystem::detail::permissions(path *p,perms prms,error_code *ec)

{
  bool bVar1;
  error_code *path1_arg;
  perms pVar2;
  perms y;
  mode_t __mode;
  int iVar3;
  unspecified_bool_type p_Var4;
  filesystem_error *pfVar5;
  value_type *__file;
  int *piVar6;
  error_category *peVar7;
  error_code ec_00;
  error_code ec_01;
  error_code local_c8;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_89;
  file_status local_88;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  file_status current_status;
  error_code local_28;
  error_code *ec_local;
  error_code *peStack_10;
  perms prms_local;
  path *p_local;
  
  ec_local._4_4_ = prms;
  peStack_10 = (error_code *)p;
  pVar2 = operator&(prms,add_perms);
  if (pVar2 != no_perms) {
    pVar2 = operator&(ec_local._4_4_,remove_perms);
    bVar1 = false;
    if (pVar2 != no_perms) goto LAB_0011438e;
  }
  bVar1 = true;
LAB_0011438e:
  if (!bVar1) {
    __assert_fail("(!((prms & add_perms) && (prms & remove_perms)))&&(\"add_perms and remove_perms are mutually exclusive\")"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                  ,0x572,
                  "void boost::filesystem::detail::permissions(const path &, perms, system::error_code *)"
                 );
  }
  pVar2 = operator&(ec_local._4_4_,add_perms);
  if ((pVar2 == no_perms) || (pVar2 = operator&(ec_local._4_4_,remove_perms), pVar2 == no_perms)) {
    system::error_code::error_code((error_code *)&current_status);
    pVar2 = operator&(ec_local._4_4_,symlink_perms);
    if (pVar2 == no_perms) {
      filesystem::status((filesystem *)local_38,(path *)peStack_10,(error_code *)&current_status);
    }
    else {
      filesystem::symlink_status((path *)local_38,peStack_10);
    }
    p_Var4 = system::error_code::operator_cast_to_function_pointer((error_code *)&current_status);
    if (p_Var4 == (unspecified_bool_type)0x0) {
      pVar2 = operator&(ec_local._4_4_,add_perms);
      if (pVar2 == no_perms) {
        pVar2 = operator&(ec_local._4_4_,remove_perms);
        if (pVar2 != no_perms) {
          pVar2 = file_status::permissions((file_status *)local_38);
          y = operator~(ec_local._4_4_);
          ec_local._4_4_ = operator&(pVar2,y);
        }
      }
      else {
        pVar2 = file_status::permissions((file_status *)local_38);
        operator|=((perms *)((long)&ec_local + 4),pVar2);
      }
      __file = filesystem::path::c_str((path *)peStack_10);
      __mode = mode_cast(ec_local._4_4_);
      iVar3 = chmod(__file,__mode);
      if (iVar3 != 0) {
        if (ec == (error_code *)0x0) {
          pfVar5 = (filesystem_error *)__cxa_allocate_exception(0x50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,"boost::filesystem::permissions",&local_b1);
          path1_arg = peStack_10;
          piVar6 = __errno_location();
          iVar3 = *piVar6;
          peVar7 = system::generic_category();
          system::error_code::error_code(&local_c8,iVar3,peVar7);
          ec_01._4_4_ = 0;
          ec_01.m_val = local_c8.m_val;
          ec_01.m_cat = local_c8.m_cat;
          filesystem_error::filesystem_error(pfVar5,&local_b0,(path *)path1_arg,ec_01);
          __cxa_throw(pfVar5,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
        }
        piVar6 = __errno_location();
        iVar3 = *piVar6;
        peVar7 = system::generic_category();
        system::error_code::assign(ec,iVar3,peVar7);
      }
    }
    else {
      if (ec == (error_code *)0x0) {
        local_89 = 1;
        pfVar5 = (filesystem_error *)__cxa_allocate_exception(0x50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"boost::filesystem::permissions",&local_59);
        local_88 = current_status;
        ec_00._0_8_ = (ulong)current_status & 0xffffffff;
        ec_00.m_cat = (error_category *)local_28._0_8_;
        filesystem_error::filesystem_error(pfVar5,&local_58,(path *)peStack_10,ec_00);
        local_89 = 0;
        __cxa_throw(pfVar5,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
      }
      ec->m_val = current_status.m_value;
      *(perms *)&ec->field_0x4 = current_status.m_perms;
      ec->m_cat = (error_category *)local_28._0_8_;
    }
  }
  return;
}

Assistant:

BOOST_FILESYSTEM_DECL
  void permissions(const path& p, perms prms, system::error_code* ec)
  {
    BOOST_ASSERT_MSG(!((prms & add_perms) && (prms & remove_perms)),
      "add_perms and remove_perms are mutually exclusive");

    if ((prms & add_perms) && (prms & remove_perms))  // precondition failed
      return;

# ifdef BOOST_POSIX_API
    error_code local_ec;
    file_status current_status((prms & symlink_perms)
                               ? fs::symlink_status(p, local_ec)
                               : fs::status(p, local_ec));
    if (local_ec)
    {
      if (ec == 0)
      BOOST_FILESYSTEM_THROW(filesystem_error(
          "boost::filesystem::permissions", p, local_ec));
      else
        *ec = local_ec;
      return;
    }

    if (prms & add_perms)
      prms |= current_status.permissions();
    else if (prms & remove_perms)
      prms = current_status.permissions() & ~prms;

    // OS X <10.10, iOS <8.0 and some other platforms don't support fchmodat().
    // Solaris (SunPro and gcc) only support fchmodat() on Solaris 11 and higher,
    // and a runtime check is too much trouble.
    // Linux does not support permissions on symbolic links and has no plans to
    // support them in the future.  The chmod() code is thus more practical,
    // rather than always hitting ENOTSUP when sending in AT_SYMLINK_NO_FOLLOW.
    //  - See the 3rd paragraph of
    // "Symbolic link ownership, permissions, and timestamps" at:
    //   "http://man7.org/linux/man-pages/man7/symlink.7.html"
    //  - See the fchmodat() Linux man page:
    //   "http://man7.org/linux/man-pages/man2/fchmodat.2.html"
#   if defined(AT_FDCWD) && defined(AT_SYMLINK_NOFOLLOW) \
      && !(defined(__SUNPRO_CC) || defined(__sun) || defined(sun)) \
      && !(defined(linux) || defined(__linux) || defined(__linux__)) \
      && !(defined(__MAC_OS_X_VERSION_MIN_REQUIRED) \
           && __MAC_OS_X_VERSION_MIN_REQUIRED < 101000) \
      && !(defined(__IPHONE_OS_VERSION_MIN_REQUIRED) \
           && __IPHONE_OS_VERSION_MIN_REQUIRED < 80000)
      if (::fchmodat(AT_FDCWD, p.c_str(), mode_cast(prms),
           !(prms & symlink_perms) ? 0 : AT_SYMLINK_NOFOLLOW))
#   else  // fallback if fchmodat() not supported
      if (::chmod(p.c_str(), mode_cast(prms)))
#   endif
    {
      if (ec == 0)
      BOOST_FILESYSTEM_THROW(filesystem_error(
          "boost::filesystem::permissions", p,
          error_code(errno, system::generic_category())));
      else
        ec->assign(errno, system::generic_category());
    }

# else  // Windows

    // if not going to alter FILE_ATTRIBUTE_READONLY, just return
    if (!(!((prms & (add_perms | remove_perms)))
      || (prms & (owner_write|group_write|others_write))))
      return;

    DWORD attr = ::GetFileAttributesW(p.c_str());

    if (error(attr == 0 ? BOOST_ERRNO : 0, p, ec, "boost::filesystem::permissions"))
      return;

    if (prms & add_perms)
      attr &= ~FILE_ATTRIBUTE_READONLY;
    else if (prms & remove_perms)
      attr |= FILE_ATTRIBUTE_READONLY;
    else if (prms & (owner_write|group_write|others_write))
      attr &= ~FILE_ATTRIBUTE_READONLY;
    else
      attr |= FILE_ATTRIBUTE_READONLY;

    error(::SetFileAttributesW(p.c_str(), attr) == 0 ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::permissions");
# endif
  }